

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libypspur-md.c
# Opt level: O2

int YPSpur_md_set_angaccel(YPSpur *spur,double dw)

{
  int iVar1;
  YPSpur_msg msg;
  
  msg.msg_type = 1;
  msg.pid = (long)spur->pid;
  msg.type = 0x53;
  msg.data[0] = dw;
  iVar1 = (*(spur->dev).send)(&spur->dev,&msg);
  if (iVar1 < 0) {
    spur->connection_error = 1;
    iVar1 = -1;
  }
  else {
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int YPSpur_md_set_angaccel(YPSpur* spur, double dw)
{
  YPSpur_msg msg;

  msg.msg_type = YPSPUR_MSG_CMD;
  msg.pid = spur->pid;
  msg.type = YPSPUR_SET_ANGACCEL;
  msg.data[0] = dw;

  if (spur->dev.send(&spur->dev, &msg) < 0)
  {
    /* error */
    spur->connection_error = 1;
    return -1;
  }

  return 1;
}